

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O3

void Pla_ManConvertFromBits(Pla_Man_t *p)

{
  word *pwVar1;
  uint uVar2;
  Vec_Int_t *pVVar3;
  int *piVar4;
  Vec_Int_t *pVVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  int iVar9;
  size_t __size;
  int iVar10;
  bool bVar11;
  int iVar12;
  int iVar15;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  long lVar18;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  uint uVar21;
  uint uVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  ulong uVar25;
  uint uVar29;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  ulong uVar30;
  uint uVar31;
  
  auVar17 = _DAT_0093d220;
  iVar9 = (p->vCubeLits).nSize;
  if (0 < (long)iVar9) {
    pVVar3 = (p->vCubeLits).pArray;
    lVar8 = (long)iVar9 + -1;
    auVar13._8_4_ = (int)lVar8;
    auVar13._0_8_ = lVar8;
    auVar13._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar13 = auVar13 ^ _DAT_0093d220;
    auVar27 = _DAT_0093e4e0;
    auVar19 = _DAT_0093d210;
    do {
      auVar26 = auVar19 ^ auVar17;
      iVar15 = auVar13._4_4_;
      if ((bool)(~(auVar26._4_4_ == iVar15 && auVar13._0_4_ < auVar26._0_4_ ||
                  iVar15 < auVar26._4_4_) & 1)) {
        *(undefined4 *)((long)&pVVar3->nSize + lVar8) = 0;
      }
      if ((auVar26._12_4_ != auVar13._12_4_ || auVar26._8_4_ <= auVar13._8_4_) &&
          auVar26._12_4_ <= auVar13._12_4_) {
        *(undefined4 *)((long)&pVVar3[1].nSize + lVar8) = 0;
      }
      auVar26 = auVar27 ^ auVar17;
      iVar12 = auVar26._4_4_;
      if (iVar12 <= iVar15 && (iVar12 != iVar15 || auVar26._0_4_ <= auVar13._0_4_)) {
        *(undefined4 *)((long)&pVVar3[2].nSize + lVar8) = 0;
        *(undefined4 *)((long)&pVVar3[3].nSize + lVar8) = 0;
      }
      lVar18 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar18 + 4;
      lVar18 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 4;
      auVar27._8_8_ = lVar18 + 4;
      lVar8 = lVar8 + 0x40;
    } while ((ulong)(iVar9 + 3U >> 2) << 6 != lVar8);
  }
  (p->vCubeLits).nSize = 0;
  auVar17 = _DAT_0093d220;
  iVar9 = (p->vOccurs).nSize;
  if (0 < (long)iVar9) {
    pVVar3 = (p->vOccurs).pArray;
    lVar8 = (long)iVar9 + -1;
    auVar14._8_4_ = (int)lVar8;
    auVar14._0_8_ = lVar8;
    auVar14._12_4_ = (int)((ulong)lVar8 >> 0x20);
    lVar8 = 0;
    auVar14 = auVar14 ^ _DAT_0093d220;
    auVar26 = _DAT_0093e4e0;
    auVar20 = _DAT_0093d210;
    do {
      auVar27 = auVar20 ^ auVar17;
      iVar15 = auVar14._4_4_;
      if ((bool)(~(auVar27._4_4_ == iVar15 && auVar14._0_4_ < auVar27._0_4_ ||
                  iVar15 < auVar27._4_4_) & 1)) {
        *(undefined4 *)((long)&pVVar3->nSize + lVar8) = 0;
      }
      if ((auVar27._12_4_ != auVar14._12_4_ || auVar27._8_4_ <= auVar14._8_4_) &&
          auVar27._12_4_ <= auVar14._12_4_) {
        *(undefined4 *)((long)&pVVar3[1].nSize + lVar8) = 0;
      }
      auVar27 = auVar26 ^ auVar17;
      iVar12 = auVar27._4_4_;
      if (iVar12 <= iVar15 && (iVar12 != iVar15 || auVar27._0_4_ <= auVar14._0_4_)) {
        *(undefined4 *)((long)&pVVar3[2].nSize + lVar8) = 0;
        *(undefined4 *)((long)&pVVar3[3].nSize + lVar8) = 0;
      }
      lVar18 = auVar20._8_8_;
      auVar20._0_8_ = auVar20._0_8_ + 4;
      auVar20._8_8_ = lVar18 + 4;
      lVar18 = auVar26._8_8_;
      auVar26._0_8_ = auVar26._0_8_ + 4;
      auVar26._8_8_ = lVar18 + 4;
      lVar8 = lVar8 + 0x40;
    } while ((ulong)(iVar9 + 3U >> 2) << 6 != lVar8);
  }
  (p->vOccurs).nSize = 0;
  iVar9 = (p->vCubes).nSize;
  iVar15 = (p->vCubeLits).nCap;
  if (iVar15 < iVar9) {
    pVVar3 = (p->vCubeLits).pArray;
    if (pVVar3 == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc((long)iVar9 << 4);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(pVVar3,(long)iVar9 << 4);
      iVar15 = (p->vCubeLits).nCap;
    }
    (p->vCubeLits).pArray = pVVar3;
    memset(pVVar3 + iVar15,0,(long)(iVar9 - iVar15) << 4);
    (p->vCubeLits).nCap = iVar9;
  }
  (p->vCubeLits).nSize = iVar9;
  iVar15 = p->nIns * 2;
  iVar9 = (p->vOccurs).nCap;
  if (iVar9 < iVar15) {
    pVVar3 = (p->vOccurs).pArray;
    __size = (long)p->nIns << 5;
    if (pVVar3 == (Vec_Int_t *)0x0) {
      pVVar3 = (Vec_Int_t *)malloc(__size);
    }
    else {
      pVVar3 = (Vec_Int_t *)realloc(pVVar3,__size);
      iVar9 = (p->vOccurs).nCap;
    }
    (p->vOccurs).pArray = pVVar3;
    memset(pVVar3 + iVar9,0,(long)(iVar15 - iVar9) << 4);
    (p->vOccurs).nCap = iVar15;
  }
  (p->vOccurs).nSize = iVar15;
  if (0 < (p->vCubes).nSize) {
    lVar8 = 0;
    do {
      iVar9 = (int)lVar8;
      uVar2 = p->nInWords * iVar9;
      if (((int)uVar2 < 0) || ((p->vInBits).nSize <= (int)uVar2)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWrd.h"
                      ,0x1be,"word *Vec_WrdEntryP(Vec_Wrd_t *, int)");
      }
      if ((p->vCubeLits).nSize <= lVar8) {
LAB_003f94e1:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      pwVar1 = (p->vInBits).pArray;
      iVar15 = p->nIns;
      if (iVar15 < 1) {
        iVar12 = 0;
      }
      else {
        uVar7 = 0;
        uVar21 = 0;
        uVar22 = 1;
        auVar17 = (undefined1  [16])0x0;
        do {
          auVar27 = auVar17;
          auVar16._0_4_ = -(uint)((int)(iVar15 - 1U ^ 0x80000000) < (int)(uVar21 ^ 0x80000000));
          auVar16._4_4_ = -(uint)((int)(iVar15 - 1U ^ 0x80000000) < (int)(uVar22 ^ 0x80000000));
          auVar16._8_8_ = 0;
          auVar23 = auVar27;
          if ((~auVar16._0_4_ & 1) != 0) {
            auVar23._8_8_ = 0;
            auVar23._0_8_ = pwVar1[(ulong)uVar2 + (ulong)(uVar7 >> 5)];
          }
          if ((((ushort)auVar16._4_4_ ^ 0xffff) & 1) != 0) {
            auVar23._8_8_ = pwVar1[(ulong)uVar2 + (ulong)(uVar7 >> 5)];
          }
          auVar24._4_4_ = uVar22 * 2;
          auVar24._0_4_ = uVar21 * 2;
          auVar24._8_8_ = 0;
          auVar28._4_12_ = SUB1612((undefined1  [16])0x0,4);
          auVar28._0_4_ = SUB164(auVar24 & _DAT_009b2ca0,0);
          uVar25 = 3L << auVar28._0_8_ & auVar23._0_8_;
          uVar30 = 3L << (SUB168(auVar24 & _DAT_009b2ca0,8) >> 0x20) & auVar23._8_8_;
          uVar29 = -(uint)((int)uVar30 == 0);
          uVar31 = -(uint)((int)(uVar30 >> 0x20) == 0);
          auVar17._0_4_ =
               (auVar27._0_4_ - (uint)((int)uVar25 == 0 && (int)(uVar25 >> 0x20) == 0)) + 1;
          auVar17._4_4_ = (uVar29 & uVar31) + auVar27._4_4_ + 1;
          auVar17._8_4_ = (uVar29 & uVar31) + auVar27._8_4_ + 1;
          auVar17._12_4_ = (uVar31 & uVar29) + auVar27._12_4_ + 1;
          uVar7 = uVar7 + 2;
          uVar21 = uVar21 + 2;
          uVar22 = uVar22 + 2;
        } while ((iVar15 + 1U & 0xfffffffe) != uVar7);
        auVar17 = ~auVar16 & auVar17 | auVar27 & auVar16;
        iVar12 = auVar17._4_4_ + auVar17._0_4_;
      }
      pVVar3 = (p->vCubeLits).pArray + lVar8;
      iVar6 = pVVar3->nCap;
      if (pVVar3->nCap < iVar12) {
        if (pVVar3->pArray == (int *)0x0) {
          piVar4 = (int *)malloc((long)iVar12 << 2);
        }
        else {
          piVar4 = (int *)realloc(pVVar3->pArray,(long)iVar12 << 2);
        }
        pVVar3->pArray = piVar4;
        if (piVar4 == (int *)0x0) {
          __assert_fail("p->pArray",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                        ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
        }
        pVVar3->nCap = iVar12;
        iVar15 = p->nIns;
        iVar6 = iVar12;
      }
      if (0 < iVar15) {
        uVar7 = iVar9 + 1;
        iVar12 = 0;
        uVar21 = 0;
        do {
          uVar25 = pwVar1[(ulong)uVar2 + (ulong)(uVar21 >> 5)] >> ((byte)iVar12 & 0x3e);
          if ((uVar25 & 3) != 0) {
            bVar11 = ((uint)uVar25 & 3) == 1;
            iVar15 = (p->vCubeLits).nSize;
            if (iVar15 <= lVar8) {
              uVar22 = iVar15 * 2;
              if ((int)uVar22 <= (int)uVar7) {
                uVar22 = uVar7;
              }
              iVar15 = (p->vCubeLits).nCap;
              if (iVar15 < (int)uVar22) {
                pVVar5 = (p->vCubeLits).pArray;
                if (pVVar5 == (Vec_Int_t *)0x0) {
                  pVVar5 = (Vec_Int_t *)malloc((ulong)uVar22 << 4);
                }
                else {
                  pVVar5 = (Vec_Int_t *)realloc(pVVar5,(ulong)uVar22 << 4);
                  iVar15 = (p->vCubeLits).nCap;
                }
                (p->vCubeLits).pArray = pVVar5;
                memset(pVVar5 + iVar15,0,(long)(int)(uVar22 - iVar15) << 4);
                (p->vCubeLits).nCap = uVar22;
              }
              (p->vCubeLits).nSize = uVar7;
            }
            uVar22 = (uint)bVar11 + iVar12;
            Vec_IntPush((p->vCubeLits).pArray + lVar8,uVar22);
            iVar15 = (p->vOccurs).nSize;
            if (iVar15 <= (int)uVar22) {
              iVar10 = (uint)bVar11 + iVar12 + 1;
              iVar6 = iVar15 * 2;
              if (iVar15 * 2 <= iVar10) {
                iVar6 = iVar10;
              }
              iVar15 = (p->vOccurs).nCap;
              if (iVar15 < iVar6) {
                pVVar5 = (p->vOccurs).pArray;
                if (pVVar5 == (Vec_Int_t *)0x0) {
                  pVVar5 = (Vec_Int_t *)malloc((long)iVar6 << 4);
                }
                else {
                  pVVar5 = (Vec_Int_t *)realloc(pVVar5,(long)iVar6 << 4);
                  iVar15 = (p->vOccurs).nCap;
                }
                (p->vOccurs).pArray = pVVar5;
                memset(pVVar5 + iVar15,0,(long)(iVar6 - iVar15) << 4);
                (p->vOccurs).nCap = iVar6;
              }
              (p->vOccurs).nSize = iVar10;
              iVar15 = iVar10;
            }
            if ((iVar12 < 0) || (iVar15 <= (int)uVar22)) goto LAB_003f94e1;
            Vec_IntPush((p->vOccurs).pArray + uVar22,iVar9);
            iVar15 = p->nIns;
          }
          uVar21 = uVar21 + 1;
          iVar12 = iVar12 + 2;
        } while ((int)uVar21 < iVar15);
        iVar6 = pVVar3->nCap;
      }
      if (pVVar3->nSize != iVar6) {
        __assert_fail("Vec_IntSize(vCube) == Vec_IntCap(vCube)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaMan.c"
                      ,0xf8,"void Pla_ManConvertFromBits(Pla_Man_t *)");
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 < (p->vCubes).nSize);
  }
  return;
}

Assistant:

void Pla_ManConvertFromBits( Pla_Man_t * p )
{
    Vec_Int_t * vCube;
    word * pCube; int i, k, Lit, Count;
    Vec_WecClear( &p->vCubeLits );
    Vec_WecClear( &p->vOccurs );
    Vec_WecInit( &p->vCubeLits, Pla_ManCubeNum(p) );
    Vec_WecInit( &p->vOccurs, 2*Pla_ManInNum(p) );
    Pla_ForEachCubeIn( p, pCube, i )
    {
        vCube = Vec_WecEntry( &p->vCubeLits, i );

        Count = 0;
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
                Count++;
        Vec_IntGrow( vCube, Count );

        Count = 0;
        Pla_CubeForEachLitIn( p, pCube, Lit, k )
            if ( Lit != PLA_LIT_DASH )
            {
                Lit = Abc_Var2Lit( k, Lit == PLA_LIT_ZERO );
                Vec_WecPush( &p->vCubeLits, i, Lit );
//                Vec_WecPush( &p->vOccurs, Lit, Pla_CubeHandle(i, Count++) );
                Vec_WecPush( &p->vOccurs, Lit, i );
            }
        assert( Vec_IntSize(vCube) == Vec_IntCap(vCube) );
    }
}